

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Scaler::MergeFrom(Scaler *this,Scaler *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_c1;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/Scaler.pb.cc"
               ,0x114);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->shiftvalue_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->shiftvalue_,iVar1 + (this->shiftvalue_).current_size_);
    memcpy(((this->shiftvalue_).rep_)->elements + (this->shiftvalue_).current_size_,
           ((from->shiftvalue_).rep_)->elements,(long)(from->shiftvalue_).current_size_ << 3);
    (this->shiftvalue_).current_size_ =
         (this->shiftvalue_).current_size_ + (from->shiftvalue_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c0,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c1,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  iVar1 = (from->scalevalue_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<double>::Reserve
              (&this->scalevalue_,iVar1 + (this->scalevalue_).current_size_);
    memcpy(((this->scalevalue_).rep_)->elements + (this->scalevalue_).current_size_,
           ((from->scalevalue_).rep_)->elements,(long)(from->scalevalue_).current_size_ << 3);
    (this->scalevalue_).current_size_ =
         (this->scalevalue_).current_size_ + (from->scalevalue_).current_size_;
  }
  return;
}

Assistant:

void Scaler::MergeFrom(const Scaler& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Scaler)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  shiftvalue_.MergeFrom(from.shiftvalue_);
  scalevalue_.MergeFrom(from.scalevalue_);
}